

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_std(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict10 *tcg_ctx_00;
  uint64_t uVar3;
  TCGContext_conflict10 *pTVar4;
  TCGv_i64 pTVar5;
  TCGv_ptr pTVar6;
  TCGTemp *pTVar7;
  uint32_t error;
  uintptr_t o_8;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar8;
  uintptr_t o_2;
  uint32_t excp;
  code *func;
  MemOp_conflict memop;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_7;
  TCGv_i64 pTVar9;
  TCGv_i64 EA;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i64 local_40;
  long local_38;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar8 = uVar1 >> 0x15 & 0x1f;
  if ((uVar1 & 3) == 2) {
    uVar3 = ctx->insns_flags2;
    if ((ctx->insns_flags & 0x40) == 0) {
      gen_exception_err(ctx,0x60,0x21);
    }
    if (((uint)uVar3 >> 0xd & 1) == 0) {
      if (ctx->pr == true) {
        excp = 6;
        error = 0x31;
        goto LAB_00b92e7a;
      }
      if (ctx->le_mode == true) {
        error = ctx->opcode & 0x3ff0000 | 3;
        excp = 5;
        goto LAB_00b92e7a;
      }
    }
    if ((uVar1 >> 0x15 & 1) == 0) {
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar4 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar4,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar4),0x20);
        ctx->access_type = 0x20;
      }
      pTVar7 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
      EA = (TCGv_i64)((long)pTVar7 - (long)tcg_ctx_00);
      gen_addr_imm_index(ctx,EA,3);
      pTVar9 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar8 * 8 | 8));
      pTVar5 = cpu_gpr[uVar8];
      if ((((ctx->base).tb)->cflags & 0x80000) == 0) {
        if (ctx->le_mode == true) {
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,pTVar9,EA,(long)ctx->mem_idx,MO_64);
          pTVar4 = ctx->uc->tcg_ctx;
          tcg_gen_addi_i64_ppc64(pTVar4,EA,EA,8);
          if (ctx->sf_mode == false) {
            tcg_gen_ext32u_i64_ppc64(pTVar4,EA,EA);
          }
          iVar2 = ctx->mem_idx;
          memop = MO_64;
          pTVar9 = pTVar5;
        }
        else {
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,pTVar5,EA,(long)ctx->mem_idx,MO_BEQ);
          pTVar4 = ctx->uc->tcg_ctx;
          tcg_gen_addi_i64_ppc64(pTVar4,EA,EA,8);
          if (ctx->sf_mode == false) {
            tcg_gen_ext32u_i64_ppc64(pTVar4,EA,EA);
          }
          iVar2 = ctx->mem_idx;
          memop = MO_BEQ;
        }
        tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,pTVar9,EA,(long)iVar2,memop);
      }
      else {
        pTVar7 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I32,false);
        if (ctx->le_mode == true) {
          tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)pTVar7,
                            (ulong)(uint)ctx->mem_idx | 0x30);
          pTVar6 = tcg_ctx_00->cpu_env;
          func = helper_stq_le_parallel;
        }
        else {
          tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)pTVar7,(ulong)(ctx->mem_idx | 0xb0)
                           );
          pTVar6 = tcg_ctx_00->cpu_env;
          func = helper_stq_be_parallel;
        }
        local_38 = (long)tcg_ctx_00 + ((long)pTVar7 - (long)tcg_ctx_00);
        local_40 = pTVar5 + (long)tcg_ctx_00;
        local_48 = pTVar9 + (long)tcg_ctx_00;
        local_58 = (TCGTemp *)(pTVar6 + (long)tcg_ctx_00);
        local_50 = (TCGv_i64)((long)tcg_ctx_00 + (long)EA);
        tcg_gen_callN_ppc64(tcg_ctx_00,func,(TCGTemp *)0x0,5,&local_58);
        tcg_temp_free_internal_ppc64
                  (tcg_ctx_00,(TCGTemp *)(((long)pTVar7 - (long)tcg_ctx_00) + (long)tcg_ctx_00));
      }
      tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(EA + (long)tcg_ctx_00));
      return;
    }
  }
  else if ((uVar1 & 0x1f0001) != 1) {
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),
                        0x20);
      ctx->access_type = 0x20;
    }
    pTVar7 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
    pTVar9 = (TCGv_i64)((long)pTVar7 - (long)tcg_ctx_00);
    gen_addr_imm_index(ctx,pTVar9,3);
    tcg_gen_qemu_st_i64_ppc64
              (ctx->uc->tcg_ctx,cpu_gpr[uVar8],pTVar9,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    if (((ctx->opcode & 1) != 0) &&
       (pTVar5 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)), pTVar5 != pTVar9
       )) {
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)tcg_ctx_00),
                        (TCGArg)pTVar7);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar9 + (long)tcg_ctx_00));
    return;
  }
  excp = 0x60;
  error = 0x21;
LAB_00b92e7a:
  gen_exception_err(ctx,excp,error);
  return;
}

Assistant:

static void gen_std(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs;
    TCGv EA;

    rs = rS(ctx->opcode);
    if ((ctx->opcode & 0x3) == 0x2) { /* stq */
        bool legal_in_user_mode = (ctx->insns_flags2 & PPC2_LSQ_ISA207) != 0;
        bool le_is_supported = (ctx->insns_flags2 & PPC2_LSQ_ISA207) != 0;
        TCGv hi, lo;

        if (!(ctx->insns_flags & PPC_64BX)) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        }

        if (!legal_in_user_mode && ctx->pr) {
            gen_priv_exception(ctx, POWERPC_EXCP_PRIV_OPC);
            return;
        }

        if (!le_is_supported && ctx->le_mode) {
            gen_align_no_le(ctx);
            return;
        }

        if (unlikely(rs & 1)) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
            return;
        }
        gen_set_access_type(ctx, ACCESS_INT);
        EA = tcg_temp_new(tcg_ctx);
        gen_addr_imm_index(ctx, EA, 0x03);

        /* Note that the low part is always in RS+1, even in LE mode.  */
        lo = cpu_gpr[rs + 1];
        hi = cpu_gpr[rs];

        if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
            if (HAVE_ATOMIC128) {
                TCGv_i32 oi = tcg_temp_new_i32(tcg_ctx);
                if (ctx->le_mode) {
                    tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_LEQ, ctx->mem_idx));
                    gen_helper_stq_le_parallel(tcg_ctx, tcg_ctx->cpu_env, EA, lo, hi, oi);
                } else {
                    tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_BEQ, ctx->mem_idx));
                    gen_helper_stq_be_parallel(tcg_ctx, tcg_ctx->cpu_env, EA, lo, hi, oi);
                }
                tcg_temp_free_i32(tcg_ctx, oi);
            } else {
                /* Restart with exclusive lock.  */
                gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
                ctx->base.is_jmp = DISAS_NORETURN;
            }
        } else if (ctx->le_mode) {
            tcg_gen_qemu_st_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_LEQ);
            gen_addr_add(ctx, EA, EA, 8);
            tcg_gen_qemu_st_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_LEQ);
        } else {
            tcg_gen_qemu_st_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_BEQ);
            gen_addr_add(ctx, EA, EA, 8);
            tcg_gen_qemu_st_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_BEQ);
        }
        tcg_temp_free(tcg_ctx, EA);
    } else {
        /* std / stdu */
        if (Rc(ctx->opcode)) {
            if (unlikely(rA(ctx->opcode) == 0)) {
                gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
                return;
            }
        }
        gen_set_access_type(ctx, ACCESS_INT);
        EA = tcg_temp_new(tcg_ctx);
        gen_addr_imm_index(ctx, EA, 0x03);
        gen_qemu_st64_i64(ctx, cpu_gpr[rs], EA);
        if (Rc(ctx->opcode)) {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], EA);
        }
        tcg_temp_free(tcg_ctx, EA);
    }
}